

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_rotate(lua_State *L,int idx,int n)

{
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StkId from;
  StkId L_00;
  StkId from_00;
  
  if (idx < 1) {
    L_00 = (L->top).p + idx;
  }
  else {
    L_00 = (L->ci->func).p + (uint)idx;
  }
  from = (L->top).p + -1;
  if (n < 0) {
    from_00 = L_00 + (-1 - (long)n);
  }
  else {
    from_00 = from + -(ulong)(uint)n;
  }
  reverse((lua_State *)&L_00->val,from_00,(StkId)CONCAT44(in_register_00000014,n));
  reverse((lua_State *)&from_00[1].val,from,(StkId)CONCAT44(extraout_var,extraout_EDX));
  reverse((lua_State *)&L_00->val,from,(StkId)CONCAT44(extraout_var_00,extraout_EDX_00));
  return;
}

Assistant:

LUA_API void lua_rotate (lua_State *L, int idx, int n) {
  StkId p, t, m;
  lua_lock(L);
  t = L->top.p - 1;  /* end of stack segment being rotated */
  p = index2stack(L, idx);  /* start of segment */
  api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
  m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
  reverse(L, p, m);  /* reverse the prefix with length 'n' */
  reverse(L, m + 1, t);  /* reverse the suffix */
  reverse(L, p, t);  /* reverse the entire segment */
  lua_unlock(L);
}